

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
find_key(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
         *this,int *key)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  undefined8 in_XMM0_Qa;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  this->num_lookups_ = this->num_lookups_ + 1;
  iVar2 = *key;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (this->super_AlexNode<int,_int>).model_.a_;
  piVar3 = this->key_slots_;
  auVar12._0_8_ = (double)iVar2;
  auVar12._8_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->super_AlexNode<int,_int>).model_.b_;
  auVar1 = vfmadd213sd_fma(auVar12,auVar13,auVar1);
  uVar4 = this->data_capacity_ - 1;
  uVar6 = (int)auVar1._0_8_;
  if ((int)uVar4 < (int)auVar1._0_8_) {
    uVar6 = uVar4;
  }
  uVar4 = ~((int)uVar6 >> 0x1f) & uVar6;
  if (iVar2 < piVar3[uVar4]) {
    uVar10 = 1;
    if (1 < (int)uVar6) {
      lVar8 = this->num_exp_search_iterations_;
      do {
        lVar8 = lVar8 + 1;
        if (piVar3[(int)(uVar4 - uVar10)] <= iVar2) break;
        this->num_exp_search_iterations_ = lVar8;
        uVar10 = uVar10 * 2;
      } while ((int)uVar10 < (int)uVar4);
    }
    uVar6 = uVar4;
    if ((int)uVar10 < (int)uVar4) {
      uVar6 = uVar10;
    }
    iVar9 = uVar4 - uVar6;
    iVar7 = -((int)uVar10 / 2);
  }
  else {
    iVar11 = this->data_capacity_ - uVar4;
    iVar7 = 1;
    if (1 < iVar11) {
      lVar8 = this->num_exp_search_iterations_;
      iVar7 = 1;
      do {
        lVar8 = lVar8 + 1;
        if (iVar2 < piVar3[(int)(iVar7 + uVar4)]) break;
        this->num_exp_search_iterations_ = lVar8;
        iVar7 = iVar7 * 2;
      } while (iVar7 < iVar11);
    }
    iVar9 = iVar7 / 2 + uVar4;
    if (iVar11 < iVar7) {
      iVar7 = iVar11;
    }
  }
  iVar7 = iVar7 + uVar4;
  while (iVar11 = iVar7, iVar9 < iVar11) {
    iVar5 = (iVar11 - iVar9) / 2;
    iVar7 = iVar5 + iVar9;
    if (piVar3[iVar7] <= iVar2) {
      iVar9 = iVar5 + 1 + iVar9;
      iVar7 = iVar11;
    }
  }
  uVar4 = 0xffffffff;
  if (0 < iVar9) {
    if ((iVar2 <= piVar3[iVar9 - 1U]) && (uVar4 = 0xffffffff, piVar3[iVar9 - 1U] <= iVar2)) {
      uVar4 = iVar9 - 1U;
    }
  }
  return uVar4;
}

Assistant:

int find_key(const T& key) {
    num_lookups_++;
    int predicted_pos = predict_position(key);

    // The last key slot with a certain value is guaranteed to be a real key
    // (instead of a gap)
    int pos = exponential_search_upper_bound(predicted_pos, key) - 1;
    if (pos < 0 || !key_equal(ALEX_DATA_NODE_KEY_AT(pos), key)) {
      return -1;
    } else {
      return pos;
    }
  }